

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O1

void safe_strcpy(char *dst,size_t dstlen,char *src)

{
  ulong uVar1;
  ulong __n;
  char *__src;
  
  if (src == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = strlen(src);
  }
  if (dst != src && (dstlen != 0 && dst != (char *)0x0)) {
    __src = "";
    if (src != (char *)0x0) {
      __src = src;
    }
    __n = dstlen - 1;
    if (uVar1 <= dstlen - 1) {
      __n = uVar1;
    }
    memcpy(dst,__src,__n);
    dst[__n] = '\0';
  }
  return;
}

Assistant:

void safe_strcpy(char *dst, size_t dstlen, const char *src)
{
    safe_strcpyl(dst, dstlen, src, src != 0 ? strlen(src) : 0);
}